

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_sub(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  int *piVar4;
  size_t sVar5;
  _func_void_j_decompress_ptr *p_Var6;
  JBLOCKROW paJVar7;
  d_derived_tbl *pdVar8;
  boolean bVar9;
  int iVar10;
  uint uVar11;
  uint local_cc;
  uint local_c8;
  int local_c0;
  int look_2;
  int nb_2;
  int look_1;
  int nb_1;
  int look;
  int nb;
  int ci;
  int coef_limit;
  int r;
  int k;
  int s;
  d_derived_tbl *htbl;
  JBLOCKROW block;
  savable_state state;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_40;
  int bits_left;
  bit_buf_type get_buffer;
  int blkn;
  int Se;
  int *natural_order;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar9 = process_restart(cinfo), bVar9 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      piVar4 = cinfo->natural_order;
      iVar1 = cinfo->lim_Se;
      state.last_dc_val._8_8_ = cinfo->src->next_input_byte;
      sVar5 = cinfo->src->bytes_in_buffer;
      p_Stack_40 = pjVar3[1].start_pass;
      br_state.cinfo._4_4_ = *(int *)&pjVar3[1].decode_mcu;
      p_Var6 = pjVar3[2].start_pass;
      state._0_8_ = pjVar3[2].decode_mcu;
      state.last_dc_val[1] = *(int *)&pjVar3[3].start_pass;
      for (get_buffer._0_4_ = 0; (int)get_buffer < cinfo->blocks_in_MCU;
          get_buffer._0_4_ = (int)get_buffer + 1) {
        paJVar7 = MCU_data[(int)get_buffer];
        pdVar8 = (d_derived_tbl *)(&pjVar3[10].decode_mcu)[(int)get_buffer];
        if (br_state.cinfo._4_4_ < 8) {
          bVar9 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)(state.last_dc_val + 2),
                             (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,0);
          if (bVar9 == 0) {
            return 0;
          }
          p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          if (7 < (int)br_state.get_buffer) goto LAB_0011c027;
          nb_1 = 1;
LAB_0011c098:
          r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                               (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,pdVar8,nb_1);
          if (r < 0) {
            return 0;
          }
          p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
        }
        else {
LAB_0011c027:
          uVar11 = (uint)((long)p_Stack_40 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
          if (pdVar8->look_nbits[(int)uVar11] == 0) {
            nb_1 = 9;
            goto LAB_0011c098;
          }
          br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar8->look_nbits[(int)uVar11];
          r = (int)pdVar8->look_sym[(int)uVar11];
        }
        pdVar8 = (d_derived_tbl *)(&pjVar3[0xf].decode_mcu)[(int)get_buffer];
        coef_limit = 1;
        iVar2 = *(int *)((long)&pjVar3[0x14].decode_mcu + (long)(int)get_buffer * 4);
        if (iVar2 == 0) {
          if (r != 0) {
            if (br_state.cinfo._4_4_ < r) {
              bVar9 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,r);
              if (bVar9 == 0) {
                return 0;
              }
              p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - r;
          }
        }
        else {
          if (r != 0) {
            if (br_state.cinfo._4_4_ < r) {
              bVar9 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,r);
              if (bVar9 == 0) {
                return 0;
              }
              p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - r;
            local_c8 = (uint)((long)p_Stack_40 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[r];
            if ((int)local_c8 <= bmask[r + -1]) {
              local_c8 = local_c8 - bmask[r];
            }
            r = local_c8;
          }
          iVar10 = state.last_dc_val[(long)cinfo->MCU_membership[(int)get_buffer] + -2] + r;
          state.last_dc_val[(long)cinfo->MCU_membership[(int)get_buffer] + -2] = iVar10;
          (*paJVar7)[0] = (JCOEF)iVar10;
          for (; coef_limit < iVar2; coef_limit = coef_limit + 1) {
            if (br_state.cinfo._4_4_ < 8) {
              bVar9 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,0);
              if (bVar9 == 0) {
                return 0;
              }
              p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              if (7 < (int)br_state.get_buffer) goto LAB_0011c29b;
              nb_2 = 1;
LAB_0011c30c:
              r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                                   (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,pdVar8,nb_2);
              if (r < 0) {
                return 0;
              }
              p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            else {
LAB_0011c29b:
              uVar11 = (uint)((long)p_Stack_40 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
              if (pdVar8->look_nbits[(int)uVar11] == 0) {
                nb_2 = 9;
                goto LAB_0011c30c;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar8->look_nbits[(int)uVar11];
              r = (int)pdVar8->look_sym[(int)uVar11];
            }
            uVar11 = r & 0xf;
            if (uVar11 == 0) {
              if (r >> 4 != 0xf) goto LAB_0011c6cd;
              coef_limit = coef_limit + 0xf;
            }
            else {
              coef_limit = (r >> 4) + coef_limit;
              if (br_state.cinfo._4_4_ < (int)uVar11) {
                bVar9 = jpeg_fill_bit_buffer
                                  ((bitread_working_state *)(state.last_dc_val + 2),
                                   (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,uVar11);
                if (bVar9 == 0) {
                  return 0;
                }
                p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - uVar11;
              local_cc = (uint)((long)p_Stack_40 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) &
                         bmask[(int)uVar11];
              if ((int)local_cc <= bmask[(int)(uVar11 - 1)]) {
                local_cc = local_cc - bmask[(int)uVar11];
              }
              (*paJVar7)[piVar4[coef_limit]] = (JCOEF)local_cc;
            }
          }
        }
        for (; coef_limit <= iVar1; coef_limit = coef_limit + 1) {
          if (br_state.cinfo._4_4_ < 8) {
            bVar9 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)(state.last_dc_val + 2),
                               (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,0);
            if (bVar9 == 0) {
              return 0;
            }
            p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            if (7 < (int)br_state.get_buffer) goto LAB_0011c55e;
            local_c0 = 1;
LAB_0011c5cf:
            r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,pdVar8,local_c0);
            if (r < 0) {
              return 0;
            }
            p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          else {
LAB_0011c55e:
            uVar11 = (uint)((long)p_Stack_40 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
            if (pdVar8->look_nbits[(int)uVar11] == 0) {
              local_c0 = 9;
              goto LAB_0011c5cf;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar8->look_nbits[(int)uVar11];
            r = (int)pdVar8->look_sym[(int)uVar11];
          }
          uVar11 = r & 0xf;
          if (uVar11 == 0) {
            if (r >> 4 != 0xf) break;
            coef_limit = coef_limit + 0xf;
          }
          else {
            coef_limit = (r >> 4) + coef_limit;
            if (br_state.cinfo._4_4_ < (int)uVar11) {
              bVar9 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_40,br_state.cinfo._4_4_,uVar11);
              if (bVar9 == 0) {
                return 0;
              }
              p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - uVar11;
          }
        }
LAB_0011c6cd:
      }
      cinfo->src->next_input_byte = (JOCTET *)state.last_dc_val._8_8_;
      cinfo->src->bytes_in_buffer = sVar5;
      pjVar3[1].start_pass = p_Stack_40;
      *(int *)&pjVar3[1].decode_mcu = br_state.cinfo._4_4_;
      pjVar3[2].start_pass = p_Var6;
      pjVar3[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state._0_8_;
      *(int *)&pjVar3[3].start_pass = state.last_dc_val[1];
    }
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_sub (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  const int * natural_order;
  int Se, blkn;
  BITREAD_STATE_VARS;
  savable_state state;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    natural_order = cinfo->natural_order;
    Se = cinfo->lim_Se;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(state, entropy->saved);

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      JBLOCKROW block = MCU_data[blkn];
      d_derived_tbl * htbl;
      register int s, k, r;
      int coef_limit, ci;

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      htbl = entropy->dc_cur_tbls[blkn];
      HUFF_DECODE(s, br_state, htbl, return FALSE, label1);

      htbl = entropy->ac_cur_tbls[blkn];
      k = 1;
      coef_limit = entropy->coef_limit[blkn];
      if (coef_limit) {
	/* Convert DC difference to actual value, update last_dc_val */
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	}
	ci = cinfo->MCU_membership[blkn];
	s += state.last_dc_val[ci];
	state.last_dc_val[ci] = s;
	/* Output the DC coefficient */
	(*block)[0] = (JCOEF) s;

	/* Section F.2.2.2: decode the AC coefficients */
	/* Since zeroes are skipped, output area must be cleared beforehand */
	for (; k < coef_limit; k++) {
	  HUFF_DECODE(s, br_state, htbl, return FALSE, label2);

	  r = s >> 4;
	  s &= 15;

	  if (s) {
	    k += r;
	    CHECK_BIT_BUFFER(br_state, s, return FALSE);
	    r = GET_BITS(s);
	    s = HUFF_EXTEND(r, s);
	    /* Output coefficient in natural (dezigzagged) order.
	     * Note: the extra entries in natural_order[] will save us
	     * if k > Se, which could happen if the data is corrupted.
	     */
	    (*block)[natural_order[k]] = (JCOEF) s;
	  } else {
	    if (r != 15)
	      goto EndOfBlock;
	    k += 15;
	  }
	}
      } else {
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	}
      }

      /* Section F.2.2.2: decode the AC coefficients */
      /* In this path we just discard the values */
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, htbl, return FALSE, label3);

	r = s >> 4;
	s &= 15;

	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	} else {
	  if (r != 15)
	    break;
	  k += 15;
	}
      }

      EndOfBlock: ;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(entropy->saved, state);
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}